

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PushLoopBlockBarrier(cmMakefile *this)

{
  uint in_EAX;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->LoopBlockCounter).c,(int *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void cmMakefile::PushLoopBlockBarrier()
{
  this->LoopBlockCounter.push(0);
}